

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall
Search::search::set_label_parser(search *this,label_parser *lp,_func_bool_polylabel_ptr *is_test)

{
  vw *pvVar1;
  long lVar2;
  label_parser *plVar3;
  byte bVar4;
  
  bVar4 = 0;
  pvVar1 = this->priv->all;
  if ((pvVar1->vw_is_main == true) && (this->priv->state != INITIALIZE)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: task should not set label parser except in initialize function!",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    pvVar1 = this->priv->all;
  }
  plVar3 = &pvVar1->p->lp;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar3->default_label = lp->default_label;
    lp = (label_parser *)((long)lp + (ulong)bVar4 * -0x10 + 8);
    plVar3 = (label_parser *)((long)plVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  (this->priv->all->p->lp).test_label = (_func_bool_void_ptr *)is_test;
  this->priv->label_is_test = is_test;
  return;
}

Assistant:

void search::set_label_parser(label_parser& lp, bool (*is_test)(polylabel&))
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set label parser except in initialize function!" << endl;
  this->priv->all->p->lp = lp;
  this->priv->all->p->lp.test_label = (bool (*)(void*))is_test;
  this->priv->label_is_test = is_test;
}